

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O0

void Exa3_ManExactSynthesis(Bmc_EsPar_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Exa3_Man_t *p_00;
  abctime aVar3;
  ulong local_b8;
  word pTruth [16];
  int fCompl;
  Exa3_Man_t *p;
  abctime clkTotal;
  int local_18;
  int iMint;
  int status;
  int i;
  Bmc_EsPar_t *pPars_local;
  
  clkTotal._4_4_ = 1;
  aVar2 = Abc_Clock();
  pTruth[0xf]._4_4_ = 0;
  Abc_TtReadHex(&local_b8,pPars->pTtStr);
  if (10 < pPars->nVars) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                  ,0x523,"void Exa3_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  if (6 < pPars->nLutSize) {
    __assert_fail("pPars->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                  ,0x524,"void Exa3_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  p_00 = Exa3_ManAlloc(pPars,&local_b8);
  if ((local_b8 & 1) != 0) {
    pTruth[0xf]._4_4_ = 1;
    Abc_TtNot(&local_b8,p_00->nWords);
  }
  local_18 = Exa3_ManAddCnfStart(p_00,pPars->fOnlyAnd);
  if (local_18 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                  ,0x528,"void Exa3_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  printf("Running exact synthesis for %d-input function with %d %d-input LUTs...\n",
         (ulong)(uint)p_00->nVars,(ulong)(uint)p_00->nNodes,(ulong)(uint)p_00->nLutSize);
  if (pPars->fUseIncr != 0) {
    bmcg_sat_solver_set_nvars
              (p_00->pSat,p_00->iVar + p_00->nNodes * (1 << ((byte)p_00->nVars & 0x1f)));
    iVar1 = bmcg_sat_solver_solve(p_00->pSat,(int *)0x0,0);
    if (iVar1 != 1) {
      __assert_fail("status == GLUCOSE_SAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                    ,0x52e,"void Exa3_ManExactSynthesis(Bmc_EsPar_t *)");
    }
    local_18 = 1;
  }
  iMint = 0;
  while (clkTotal._4_4_ != -1) {
    if (pPars->fUseIncr == 0) {
      iVar1 = Exa3_ManAddCnf(p_00,clkTotal._4_4_);
    }
    else {
      iVar1 = Exa3_ManAddCnf2(p_00,clkTotal._4_4_);
    }
    if (iVar1 == 0) break;
    local_18 = bmcg_sat_solver_solve(p_00->pSat,(int *)0x0,0);
    if ((pPars->fVerbose != 0) && ((pPars->fUseIncr == 0 || (iMint % 100 == 0)))) {
      aVar3 = Abc_Clock();
      Exa3_ManPrint(p_00,iMint,clkTotal._4_4_,aVar3 - aVar2);
    }
    if ((local_18 == -1) || (local_18 == 0)) break;
    clkTotal._4_4_ = Exa3_ManEval(p_00);
    iMint = iMint + 1;
  }
  if ((pPars->fVerbose != 0) && (local_18 != 0)) {
    aVar3 = Abc_Clock();
    Exa3_ManPrint(p_00,iMint,clkTotal._4_4_,aVar3 - aVar2);
  }
  if (clkTotal._4_4_ == -1) {
    Exa3_ManPrintSolution(p_00,pTruth[0xf]._4_4_);
  }
  else if (local_18 == 0) {
    printf("The problem timed out after %d sec.\n",(ulong)(uint)pPars->RuntimeLim);
  }
  else {
    printf("The problem has no solution.\n");
  }
  printf("Added = %d.  Tried = %d.  ",(ulong)(uint)p_00->nUsed[1],(ulong)(uint)p_00->nUsed[0]);
  Exa3_ManFree(p_00);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Total runtime",aVar3 - aVar2);
  return;
}

Assistant:

void Exa3_ManExactSynthesis( Bmc_EsPar_t * pPars )
{
    int i, status, iMint = 1;
    abctime clkTotal = Abc_Clock();
    Exa3_Man_t * p; int fCompl = 0;
    word pTruth[16]; Abc_TtReadHex( pTruth, pPars->pTtStr );
    assert( pPars->nVars <= 10 );
    assert( pPars->nLutSize <= 6 );
    p = Exa3_ManAlloc( pPars, pTruth );
    if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, p->nWords ); }
    status = Exa3_ManAddCnfStart( p, pPars->fOnlyAnd );
    assert( status );
    printf( "Running exact synthesis for %d-input function with %d %d-input LUTs...\n", p->nVars, p->nNodes, p->nLutSize );
    if ( pPars->fUseIncr ) 
    {
        bmcg_sat_solver_set_nvars( p->pSat, p->iVar + p->nNodes*(1 << p->nVars) );
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        assert( status == GLUCOSE_SAT );
    }
    for ( i = 0; iMint != -1; i++ )
    {
        if ( pPars->fUseIncr ? !Exa3_ManAddCnf2( p, iMint ) : !Exa3_ManAddCnf( p, iMint ) )
            break;
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( pPars->fVerbose && (!pPars->fUseIncr || i % 100 == 0) )
            Exa3_ManPrint( p, i, iMint, Abc_Clock() - clkTotal );
        if ( status == GLUCOSE_UNSAT || status == GLUCOSE_UNDEC )
            break;
        iMint = Exa3_ManEval( p );
    }
    if ( pPars->fVerbose && status != GLUCOSE_UNDEC )
        Exa3_ManPrint( p, i, iMint, Abc_Clock() - clkTotal );
    if ( iMint == -1 )
        Exa3_ManPrintSolution( p, fCompl );
    else if ( status == GLUCOSE_UNDEC )
        printf( "The problem timed out after %d sec.\n", pPars->RuntimeLim );
    else 
        printf( "The problem has no solution.\n" );
    printf( "Added = %d.  Tried = %d.  ", p->nUsed[1], p->nUsed[0] );
    Exa3_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
}